

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall wabt::anon_unknown_0::CWriter::Unspill(CWriter *this,TypeVector *types)

{
  byte bVar1;
  pointer pTVar2;
  pointer pTVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  pTVar3 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar4 = (long)pTVar2 - (long)pTVar3 >> 3;
  if (lVar4 == 1) {
    Write(this,(StackVar *)(ulong)((int)((ulong)((long)pTVar2 - (long)pTVar3) >> 3) - 1));
    WriteData(this," = tmp;",7);
    if (this->consecutive_newline_count_ < 2) {
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    }
    this->should_write_indent_next_ = true;
  }
  else {
    if (lVar4 == 0) {
      __assert_fail("types.size() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0xbb5,
                    "void wabt::(anonymous namespace)::CWriter::Unspill(const TypeVector &, const targets &) [targets = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:3012:18)]"
                   );
    }
    if (pTVar2 != pTVar3) {
      uVar5 = 1;
      uVar6 = 0;
      do {
        Write(this,(StackVar *)
                   (ulong)((int)((ulong)((long)pTVar2 - (long)pTVar3) >> 3) + ~(uint)uVar6));
        pTVar3 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 3) <= uVar6) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar6);
        }
        bVar1 = MangleType(pTVar3[uVar6]);
        Writef(this," = tmp.%c%d;",(ulong)bVar1,(ulong)(uVar5 - 1));
        if (this->consecutive_newline_count_ < 2) {
          WriteData(this,"\n",1);
          this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
        }
        this->should_write_indent_next_ = true;
        uVar6 = (ulong)uVar5;
        pTVar3 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar5 = uVar5 + 1;
      } while (uVar6 < (ulong)((long)pTVar2 - (long)pTVar3 >> 3));
    }
  }
  return;
}

Assistant:

void CWriter::Unspill(const TypeVector& types) {
  Unspill(types, [&](auto i) { return StackVar(types.size() - i - 1); });
}